

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Vector2<float> __thiscall pbrt::Bounds2<float>::Offset(Bounds2<float> *this,Point2<float> *p)

{
  float fVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  undefined1 auVar3 [12];
  Tuple2<pbrt::Vector2,_float> TVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  TVar2 = (this->pMin).super_Tuple2<pbrt::Point2,_float>;
  auVar7._8_8_ = 0;
  auVar7._0_4_ = TVar2.x;
  auVar7._4_4_ = TVar2.y;
  fVar1 = (this->pMax).super_Tuple2<pbrt::Point2,_float>.x;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
  auVar6 = vsubps_avx(auVar5,auVar7);
  if (TVar2.x < fVar1) {
    auVar3 = auVar6._4_12_;
    auVar6._0_4_ = auVar6._0_4_ / (fVar1 - TVar2.x);
    auVar6._4_12_ = auVar3;
  }
  TVar4 = auVar6._0_8_;
  fVar1 = (this->pMax).super_Tuple2<pbrt::Point2,_float>.y;
  auVar5 = vmovshdup_avx(auVar7);
  if (auVar5._0_4_ < fVar1) {
    auVar7 = vmovshdup_avx(auVar6);
    auVar8._0_4_ = auVar7._0_4_ / (fVar1 - auVar5._0_4_);
    auVar8._4_12_ = auVar7._4_12_;
    auVar6 = vinsertps_avx(auVar6,auVar8,0x10);
    TVar4 = auVar6._0_8_;
  }
  return (Vector2<float>)TVar4;
}

Assistant:

PBRT_CPU_GPU auto operator-(const Point2<U> &p) const
        -> Vector2<decltype(T{} - U{})> {
        DCHECK(!p.HasNaN());
        return {x - p.x, y - p.y};
    }